

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_subdiv.cpp
# Opt level: O2

void __thiscall
embree::avx::BVHNSubdivPatch1MBlurBuilderSAH<4>::countSubPatches
          (BVHNSubdivPatch1MBlurBuilderSAH<4> *this,size_t *numSubPatches,size_t *numSubPatchesMB,
          ParallelForForPrefixSumState<embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_> *pstate
          )

{
  undefined1 auVar1 [16];
  char cVar2;
  int iVar3;
  size_t sVar4;
  ulong uVar5;
  runtime_error *this_00;
  ulong uVar6;
  ulong uVar7;
  size_t i_1;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  size_t sVar11;
  size_t i;
  size_t sVar12;
  PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *this_01;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 local_2c2;
  undefined1 local_2c1;
  size_t local_2c0;
  size_t *local_2b8;
  size_t *local_2b0;
  size_t taskCount;
  Iterator<embree::SubdivMesh,_true> iter;
  Iterator<embree::SubdivMesh,_true> *local_290;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_288;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_278;
  Iterator<embree::SubdivMesh,_true> **ppIStack_270;
  undefined1 *local_268;
  undefined1 **ppuStack_260;
  undefined4 local_258;
  undefined4 uStack_254;
  undefined4 uStack_250;
  undefined4 uStack_24c;
  undefined4 local_248;
  undefined4 uStack_244;
  undefined4 uStack_240;
  undefined4 uStack_23c;
  undefined4 local_238;
  undefined4 uStack_234;
  undefined4 uStack_230;
  undefined4 uStack_22c;
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined4 local_208;
  undefined8 local_204;
  undefined4 local_1fc;
  undefined1 *local_1f8;
  Iterator<embree::SubdivMesh,_true> *local_1f0;
  task_group_context context;
  PrimInfoMB pinfo;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_c8;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined4 local_48;
  undefined8 local_44;
  undefined4 local_3c;
  
  iter.scene = this->scene;
  context.my_cpu_ctl_env = (uint64_t)&iter;
  iter.all = false;
  sVar11 = ((iter.scene)->geometries).size_active;
  local_2c0 = 0;
  local_2b8 = numSubPatches;
  local_2b0 = numSubPatchesMB;
  for (sVar12 = 0; sVar11 != sVar12; sVar12 = sVar12 + 1) {
    sVar4 = ParallelForForState::init<embree::Scene::Iterator<embree::SubdivMesh,_true>_>::
            anon_class_8_1_4d25ca37::operator()((anon_class_8_1_4d25ca37 *)&context,sVar12);
    local_2c0 = local_2c0 + sVar4;
  }
  (pstate->super_ParallelForForState).N = local_2c0;
  iVar3 = tbb::detail::d1::max_concurrency();
  uVar6 = local_2c0 + 0x3ff >> 10;
  if ((ulong)(long)iVar3 < uVar6) {
    uVar6 = (long)iVar3;
  }
  uVar5 = 0x40;
  if (uVar6 < 0x40) {
    uVar5 = uVar6;
  }
  sVar12 = 0;
  sVar11 = uVar5 + (uVar5 == 0);
  (pstate->super_ParallelForForState).taskCount = sVar11;
  (pstate->super_ParallelForForState).i0[0] = 0;
  (pstate->super_ParallelForForState).j0[0] = 0;
  uVar5 = local_2c0 / sVar11;
  uVar6 = 1;
  uVar10 = 0;
  while (uVar6 < sVar11) {
    sVar4 = ParallelForForState::init<embree::Scene::Iterator<embree::SubdivMesh,_true>_>::
            anon_class_8_1_4d25ca37::operator()((anon_class_8_1_4d25ca37 *)&context,sVar12);
    sVar11 = (pstate->super_ParallelForForState).taskCount;
    uVar8 = (uVar6 + 1) * local_2c0;
    uVar9 = 0;
    uVar7 = uVar10;
    for (; ((uVar10 = (uVar7 + sVar4) - uVar9, uVar9 < sVar4 && (uVar5 <= uVar10)) &&
           (uVar6 < sVar11)); uVar6 = uVar6 + 1) {
      (pstate->super_ParallelForForState).i0[uVar6] = sVar12;
      uVar9 = uVar9 + (uVar5 - uVar7);
      (pstate->super_ParallelForForState).j0[uVar6] = uVar9;
      sVar11 = (pstate->super_ParallelForForState).taskCount;
      uVar10 = uVar8 / sVar11;
      uVar8 = uVar8 + local_2c0;
      uVar7 = uVar5;
      uVar5 = uVar10;
    }
    sVar12 = sVar12 + 1;
  }
  local_278 = &local_c8;
  local_c8.m128[0] = INFINITY;
  local_c8.m128[1] = INFINITY;
  local_c8.m128[2] = INFINITY;
  local_c8.m128[3] = INFINITY;
  local_b8 = 0xff800000;
  uStack_b4 = 0xff800000;
  uStack_b0 = 0xff800000;
  uStack_ac = 0xff800000;
  local_a8 = 0x7f800000;
  uStack_a4 = 0x7f800000;
  uStack_a0 = 0x7f800000;
  uStack_9c = 0x7f800000;
  local_98 = 0xff800000;
  uStack_94 = 0xff800000;
  uStack_90 = 0xff800000;
  uStack_8c = 0xff800000;
  local_88 = 0x7f800000;
  uStack_84 = 0x7f800000;
  uStack_80 = 0x7f800000;
  uStack_7c = 0x7f800000;
  local_78 = 0xff800000;
  uStack_74 = 0xff800000;
  uStack_70 = 0xff800000;
  uStack_6c = 0xff800000;
  local_68 = 0;
  uStack_60 = 0;
  uStack_58 = 0;
  uStack_50 = 0;
  local_48 = 0;
  auVar13._8_4_ = 0x3f800000;
  auVar13._0_8_ = 0x3f8000003f800000;
  auVar13._12_4_ = 0x3f800000;
  local_44 = vmovlps_avx(auVar13);
  local_3c = 0;
  ppIStack_270 = &local_290;
  local_290 = &iter;
  local_1f8 = &local_2c1;
  ppuStack_260 = &local_1f8;
  local_288._8_8_ = &taskCount;
  local_268 = &local_2c2;
  taskCount = sVar11;
  local_288._0_8_ = pstate;
  local_1f0 = local_290;
  tbb::detail::d1::task_group_context::task_group_context(&context,(context_traits)0x4,CUSTOM_CTX);
  pinfo.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
       &local_288;
  tbb::detail::d1::
  parallel_for<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_for_h:32:43)>
            (0,sVar11,1,(anon_class_8_1_898bcfc2_conflict10 *)&pinfo,&context);
  cVar2 = tbb::detail::r1::is_group_execution_cancelled(&context);
  if (cVar2 == '\0') {
    tbb::detail::d1::task_group_context::~task_group_context(&context);
    PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
              (&pinfo,(PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_c8.field_1);
    this_01 = (pstate->prefix_state).sums;
    for (uVar6 = 0; uVar6 < taskCount; uVar6 = uVar6 + 1) {
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&context,this_01 + -0x40);
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::operator=(this_01,&pinfo);
      local_288._0_8_ =
           (ParallelForForPrefixSumState<embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_> *)
           0x7f8000007f800000;
      local_288._8_8_ = (size_t *)0x7f8000007f800000;
      local_278 = (anon_union_16_2_47237d3f_for_Vec3fa_0 *)0xff800000ff800000;
      ppIStack_270 = (Iterator<embree::SubdivMesh,_true> **)0xff800000ff800000;
      local_268 = (undefined1 *)0x7f8000007f800000;
      ppuStack_260 = (undefined1 **)0x7f8000007f800000;
      local_258 = 0xff800000;
      uStack_254 = 0xff800000;
      uStack_250 = 0xff800000;
      uStack_24c = 0xff800000;
      local_248 = 0x7f800000;
      uStack_244 = 0x7f800000;
      uStack_240 = 0x7f800000;
      uStack_23c = 0x7f800000;
      local_238 = 0xff800000;
      uStack_234 = 0xff800000;
      uStack_230 = 0xff800000;
      uStack_22c = 0xff800000;
      auVar1._8_8_ = pinfo.object_range._end;
      auVar1._0_8_ = pinfo.object_range._begin;
      local_228 = vpaddq_avx((undefined1  [16])context.padding._24_16_,auVar1);
      local_218 = (undefined1  [16])0x0;
      local_208 = 0;
      auVar14._8_4_ = 0x3f800000;
      auVar14._0_8_ = 0x3f8000003f800000;
      auVar14._12_4_ = 0x3f800000;
      local_204 = vmovlps_avx(auVar14);
      local_1fc = 0;
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::operator=
                (&pinfo,(PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_288.field_1);
      this_01 = this_01 + 1;
    }
    *local_2b8 = pinfo.object_range._begin;
    *local_2b0 = pinfo.object_range._end;
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"task cancelled");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void countSubPatches(size_t& numSubPatches, size_t& numSubPatchesMB, ParallelForForPrefixSumState<PrimInfoMB>& pstate)
      {
        Scene::Iterator<SubdivMesh,true> iter(scene);
        pstate.init(iter,size_t(1024));

        PrimInfoMB pinfo = parallel_for_for_prefix_sum0( pstate, iter, PrimInfoMB(empty), [&](SubdivMesh* mesh, const range<size_t>& r, size_t k, size_t /*geomID*/) -> PrimInfoMB
        { 
          size_t s = 0;
          size_t sMB = 0;
          for (size_t f=r.begin(); f!=r.end(); ++f) 
          {          
            if (!mesh->valid(f)) continue;
            size_t count = patch_eval_subdivision_count(mesh->getHalfEdge(0,f));
            s += count;
            sMB += count * mesh->numTimeSteps;
          }
          return PrimInfoMB(s,sMB);
        }, [](const PrimInfoMB& a, const PrimInfoMB& b) -> PrimInfoMB { return PrimInfoMB(a.begin()+b.begin(),a.end()+b.end()); });

        numSubPatches = pinfo.begin();
        numSubPatchesMB = pinfo.end();
      }